

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

void __thiscall cmdline::cmdline_error::~cmdline_error(cmdline_error *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__cmdline_error_0013f2c8;
  pcVar1 = (this->msg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~cmdline_error() throw() {}